

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edition_unittest.pb.cc
# Opt level: O1

void edition_unittest::TestChildExtension::MergeImpl(MessageLite *to_msg,MessageLite *from_msg)

{
  uint uVar1;
  char *pcVar2;
  size_t sVar3;
  MessageLite *from_msg_00;
  MessageLite *to_msg_00;
  ulong uVar4;
  undefined8 *puVar5;
  void *pvVar6;
  Nonnull<const_char_*> pcVar7;
  Arena *pAVar8;
  Arena *arena;
  string_view value;
  string_view value_00;
  
  arena = (Arena *)(to_msg->_internal_metadata_).ptr_;
  if (((ulong)arena & 1) != 0) {
    arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
  }
  if (from_msg == to_msg) {
    pcVar7 = absl::lts_20250127::log_internal::MakeCheckOpString<void_const*,void_const*>
                       (from_msg,to_msg,"&from != _this");
  }
  else {
    pcVar7 = (Nonnull<const_char_*>)0x0;
  }
  if (pcVar7 == (Nonnull<const_char_*>)0x0) {
    uVar1 = *(uint *)&from_msg[1]._vptr_MessageLite;
    if ((uVar1 & 7) != 0) {
      if ((uVar1 & 1) != 0) {
        puVar5 = (undefined8 *)(from_msg[1]._internal_metadata_.ptr_ & 0xfffffffffffffffc);
        pcVar2 = (char *)*puVar5;
        sVar3 = puVar5[1];
        *(uint *)&to_msg[1]._vptr_MessageLite = *(uint *)&to_msg[1]._vptr_MessageLite | 1;
        pAVar8 = (Arena *)(to_msg->_internal_metadata_).ptr_;
        if (((ulong)pAVar8 & 1) != 0) {
          pAVar8 = *(Arena **)((ulong)pAVar8 & 0xfffffffffffffffe);
        }
        value._M_str = pcVar2;
        value._M_len = sVar3;
        google::protobuf::internal::ArenaStringPtr::Set
                  ((ArenaStringPtr *)&to_msg[1]._internal_metadata_,value,pAVar8);
      }
      if ((uVar1 & 2) != 0) {
        puVar5 = (undefined8 *)((ulong)from_msg[2]._vptr_MessageLite & 0xfffffffffffffffc);
        pcVar2 = (char *)*puVar5;
        sVar3 = puVar5[1];
        *(uint *)&to_msg[1]._vptr_MessageLite = *(uint *)&to_msg[1]._vptr_MessageLite | 2;
        pAVar8 = (Arena *)(to_msg->_internal_metadata_).ptr_;
        if (((ulong)pAVar8 & 1) != 0) {
          pAVar8 = *(Arena **)((ulong)pAVar8 & 0xfffffffffffffffe);
        }
        value_00._M_str = pcVar2;
        value_00._M_len = sVar3;
        google::protobuf::internal::ArenaStringPtr::Set
                  ((ArenaStringPtr *)(to_msg + 2),value_00,pAVar8);
      }
      if ((uVar1 & 4) != 0) {
        from_msg_00 = (MessageLite *)from_msg[2]._internal_metadata_.ptr_;
        if (from_msg_00 == (MessageLite *)0x0) {
          MergeImpl((TestChildExtension *)&stack0xffffffffffffffd0);
          goto LAB_00c48b2c;
        }
        to_msg_00 = (MessageLite *)to_msg[2]._internal_metadata_.ptr_;
        if (to_msg_00 == (MessageLite *)0x0) {
          pvVar6 = google::protobuf::Arena::CopyConstruct<edition_unittest::TestAllExtensions>
                             (arena,from_msg_00);
          to_msg[2]._internal_metadata_.ptr_ = (intptr_t)pvVar6;
        }
        else {
          TestAllExtensions::MergeImpl(to_msg_00,from_msg_00);
        }
      }
    }
    *(uint *)&to_msg[1]._vptr_MessageLite = *(uint *)&to_msg[1]._vptr_MessageLite | uVar1;
    uVar4 = (from_msg->_internal_metadata_).ptr_;
    if ((uVar4 & 1) == 0) {
      return;
    }
    google::protobuf::internal::InternalMetadata::DoMergeFrom<google::protobuf::UnknownFieldSet>
              (&to_msg->_internal_metadata_,(UnknownFieldSet *)((uVar4 & 0xfffffffffffffffe) + 8));
    return;
  }
LAB_00c48b2c:
  MergeImpl();
}

Assistant:

void TestChildExtension::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<TestChildExtension*>(&to_msg);
  auto& from = static_cast<const TestChildExtension&>(from_msg);
  ::google::protobuf::Arena* arena = _this->GetArena();
  // @@protoc_insertion_point(class_specific_merge_from_start:edition_unittest.TestChildExtension)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = from._impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000007u) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      _this->_internal_set_a(from._internal_a());
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      _this->_internal_set_b(from._internal_b());
    }
    if ((cached_has_bits & 0x00000004u) != 0) {
      ABSL_DCHECK(from._impl_.optional_extension_ != nullptr);
      if (_this->_impl_.optional_extension_ == nullptr) {
        _this->_impl_.optional_extension_ = ::google::protobuf::Message::CopyConstruct(arena, *from._impl_.optional_extension_);
      } else {
        _this->_impl_.optional_extension_->MergeFrom(*from._impl_.optional_extension_);
      }
    }
  }
  _this->_impl_._has_bits_[0] |= cached_has_bits;
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}